

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_observation.cc
# Opt level: O0

void __thiscall
hanabi_learning_env::HanabiObservation::HanabiObservation
          (HanabiObservation *this,HanabiState *state,int observing_player)

{
  bool bVar1;
  int iVar2;
  int num_players;
  int iVar3;
  AgentObservationType AVar4;
  HanabiGame *pHVar5;
  HanabiDeck *this_00;
  vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_> *pvVar6;
  int in_EDX;
  HanabiState *in_RSI;
  int *in_RDI;
  const_reverse_iterator it;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_hanabi_learning_env::HanabiHistoryItem_*,_std::vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>_>_>
  rend;
  __normal_iterator<const_hanabi_learning_env::HanabiHistoryItem_*,_std::vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>_>
  start;
  vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
  *history;
  int offset;
  bool show_cards;
  bool hide_knowledge;
  value_type *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  uint in_stack_fffffffffffffde4;
  int in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  HanabiGame *in_stack_fffffffffffffdf0;
  size_type in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
  *in_stack_fffffffffffffe28;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
  *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe50;
  int player;
  HanabiState *in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe94;
  HanabiGame *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 uVar7;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_hanabi_learning_env::HanabiHistoryItem_*,_std::vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>_>_>
  local_c0 [2];
  HanabiHistoryItem *local_b0;
  HanabiHistoryItem *local_a8;
  HanabiHistoryItem *local_a0;
  vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
  *local_98;
  int local_5c;
  byte local_26;
  undefined1 local_25;
  int local_14;
  HanabiState *local_10;
  
  player = (int)((ulong)in_stack_fffffffffffffe50 >> 0x20);
  local_14 = in_EDX;
  local_10 = in_RSI;
  iVar2 = HanabiState::CurPlayer(in_RSI);
  iVar3 = local_14;
  pHVar5 = HanabiState::ParentGame(local_10);
  num_players = HanabiGame::NumPlayers(pHVar5);
  iVar3 = anon_unknown_7::PlayerToOffset(iVar2,iVar3,num_players);
  *in_RDI = iVar3;
  std::vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>::
  vector((vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
          *)0x14d6c5);
  HanabiState::DiscardPile(local_10);
  std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
  vector(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  HanabiState::Fireworks(local_10);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe30,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe28);
  this_00 = HanabiState::Deck(local_10);
  iVar3 = HanabiState::HanabiDeck::Size(this_00);
  in_RDI[0x14] = iVar3;
  std::
  vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
  ::vector((vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
            *)0x14d7b4);
  iVar3 = HanabiState::InformationTokens(local_10);
  in_RDI[0x1c] = iVar3;
  iVar3 = HanabiState::LifeTokens(local_10);
  in_RDI[0x1d] = iVar3;
  HanabiState::LegalMoves(in_stack_fffffffffffffe58,player);
  pHVar5 = HanabiState::ParentGame(local_10);
  *(HanabiGame **)(in_RDI + 0x24) = pHVar5;
  uVar7 = false;
  if (-1 < local_14) {
    in_stack_fffffffffffffe94 = local_14;
    in_stack_fffffffffffffe98 = HanabiState::ParentGame(local_10);
    iVar3 = HanabiGame::NumPlayers(in_stack_fffffffffffffe98);
    uVar7 = in_stack_fffffffffffffe94 < iVar3;
  }
  if ((bool)uVar7 != false) {
    pvVar6 = HanabiState::Hands(local_10);
    std::vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>::
    size(pvVar6);
    std::vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>::
    reserve((vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
            in_stack_fffffffffffffe18);
    pHVar5 = HanabiState::ParentGame(local_10);
    AVar4 = HanabiGame::ObservationType(pHVar5);
    local_25 = AVar4 == kMinimal;
    pHVar5 = HanabiState::ParentGame(local_10);
    AVar4 = HanabiGame::ObservationType(pHVar5);
    local_26 = AVar4 == kSeer;
    pvVar6 = HanabiState::Hands(local_10);
    std::vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>::
    operator[](pvVar6,(long)local_14);
    HanabiHand::HanabiHand
              ((HanabiHand *)CONCAT17(uVar7,in_stack_fffffffffffffea0),
               (HanabiHand *)in_stack_fffffffffffffe98,
               SUB41((uint)in_stack_fffffffffffffe94 >> 0x18,0),
               SUB41((uint)in_stack_fffffffffffffe94 >> 0x10,0));
    std::vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>::
    push_back((vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
               *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
              in_stack_fffffffffffffdd8);
    HanabiHand::~HanabiHand
              ((HanabiHand *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    local_5c = 1;
    while( true ) {
      iVar3 = local_5c;
      pHVar5 = HanabiState::ParentGame(local_10);
      iVar2 = HanabiGame::NumPlayers(pHVar5);
      if (iVar2 <= iVar3) break;
      pvVar6 = HanabiState::Hands(local_10);
      iVar3 = local_14 + local_5c;
      pHVar5 = HanabiState::ParentGame(local_10);
      iVar2 = HanabiGame::NumPlayers(pHVar5);
      std::vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
      ::operator[](pvVar6,(long)(iVar3 % iVar2));
      HanabiHand::HanabiHand
                ((HanabiHand *)CONCAT17(uVar7,in_stack_fffffffffffffea0),
                 (HanabiHand *)in_stack_fffffffffffffe98,
                 SUB41((uint)in_stack_fffffffffffffe94 >> 0x18,0),
                 SUB41((uint)in_stack_fffffffffffffe94 >> 0x10,0));
      std::vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
      ::push_back((vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                   *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                  in_stack_fffffffffffffdd8);
      HanabiHand::~HanabiHand
                ((HanabiHand *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
      local_5c = local_5c + 1;
    }
    local_98 = HanabiState::MoveHistory(local_10);
    local_a8 = (HanabiHistoryItem *)
               std::
               vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
               ::begin((vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
                        *)in_stack_fffffffffffffdd8);
    local_b0 = (HanabiHistoryItem *)
               std::
               vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
               ::end((vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
                      *)in_stack_fffffffffffffdd8);
    local_a0 = (HanabiHistoryItem *)
               std::
               find_if<__gnu_cxx::__normal_iterator<hanabi_learning_env::HanabiHistoryItem_const*,std::vector<hanabi_learning_env::HanabiHistoryItem,std::allocator<hanabi_learning_env::HanabiHistoryItem>>>,hanabi_learning_env::HanabiObservation::HanabiObservation(hanabi_learning_env::HanabiState_const&,int)::__0>
                         (local_a8,local_b0);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_hanabi_learning_env::HanabiHistoryItem_*,_std::vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>_>_>
    ::reverse_iterator(local_c0,(iterator_type)local_a0);
    std::
    vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
    ::rbegin((vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
              *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    while( true ) {
      bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_hanabi_learning_env::HanabiHistoryItem_*,_std::vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                              (reverse_iterator<__gnu_cxx::__normal_iterator<const_hanabi_learning_env::HanabiHistoryItem_*,_std::vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>_>_>
                               *)in_stack_fffffffffffffdd8);
      if (!bVar1) {
        return;
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_hanabi_learning_env::HanabiHistoryItem_*,_std::vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>_>_>
      ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_hanabi_learning_env::HanabiHistoryItem_*,_std::vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
      std::
      vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
      ::push_back((vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
                   *)in_stack_fffffffffffffdf0,
                  (value_type *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      in_stack_fffffffffffffdec = local_14;
      in_stack_fffffffffffffdf0 = HanabiState::ParentGame(local_10);
      in_stack_fffffffffffffde8 = HanabiGame::NumPlayers(in_stack_fffffffffffffdf0);
      in_stack_fffffffffffffde4 = (uint)local_26;
      std::
      vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
      ::back((vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
              *)(ulong)CONCAT14(local_26,in_stack_fffffffffffffde0));
      anon_unknown_7::ChangeHistoryItemToObserverRelative
                ((int)((ulong)in_stack_fffffffffffffdf0 >> 0x20),(int)in_stack_fffffffffffffdf0,
                 SUB41((uint)in_stack_fffffffffffffdec >> 0x18,0),
                 (HanabiHistoryItem *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0))
      ;
      in_stack_fffffffffffffdd8 =
           (value_type *)
           std::
           reverse_iterator<__gnu_cxx::__normal_iterator<const_hanabi_learning_env::HanabiHistoryItem_*,_std::vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>_>_>
           ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_hanabi_learning_env::HanabiHistoryItem_*,_std::vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
      if (*(char *)&(in_stack_fffffffffffffdd8->cards_).
                    super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                    ._M_impl.super__Vector_impl_data._M_finish == local_14) break;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_hanabi_learning_env::HanabiHistoryItem_*,_std::vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_hanabi_learning_env::HanabiHistoryItem_*,_std::vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    }
    return;
  }
  __assert_fail("observing_player >= 0 && observing_player < state.ParentGame()->NumPlayers()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/hanabi_observation.cc"
                ,0x40,
                "hanabi_learning_env::HanabiObservation::HanabiObservation(const HanabiState &, int)"
               );
}

Assistant:

HanabiObservation::HanabiObservation(const HanabiState& state,
                                     int observing_player)
    : cur_player_offset_(PlayerToOffset(state.CurPlayer(), observing_player,
                                        state.ParentGame()->NumPlayers())),
      discard_pile_(state.DiscardPile()),
      fireworks_(state.Fireworks()),
      deck_size_(state.Deck().Size()),
      information_tokens_(state.InformationTokens()),
      life_tokens_(state.LifeTokens()),
      legal_moves_(state.LegalMoves(observing_player)),
      parent_game_(state.ParentGame()) {
  REQUIRE(observing_player >= 0 &&
          observing_player < state.ParentGame()->NumPlayers());
  hands_.reserve(state.Hands().size());
  const bool hide_knowledge =
      state.ParentGame()->ObservationType() == HanabiGame::kMinimal;
  const bool show_cards = state.ParentGame()->ObservationType() == HanabiGame::kSeer;
  hands_.push_back(
      HanabiHand(state.Hands()[observing_player], !show_cards, hide_knowledge));
  for (int offset = 1; offset < state.ParentGame()->NumPlayers(); ++offset) {
    hands_.push_back(HanabiHand(state.Hands()[(observing_player + offset) %
                                              state.ParentGame()->NumPlayers()],
                                false, hide_knowledge));
  }

  const auto& history = state.MoveHistory();
  auto start = std::find_if(history.begin(), history.end(),
                            [](const HanabiHistoryItem& item) {
                              return item.player != kChancePlayerId;
                            });
  std::reverse_iterator<decltype(start)> rend(start);
  for (auto it = history.rbegin(); it != rend; ++it) {
    last_moves_.push_back(*it);
    ChangeHistoryItemToObserverRelative(observing_player,
                                        state.ParentGame()->NumPlayers(),
                                        show_cards,
                                        &last_moves_.back());
    if (it->player == observing_player) {
      break;
    }
  }
}